

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O0

void __thiscall QMenuPrivate::_q_actionHovered(QMenuPrivate *this)

{
  QAction *_t1;
  QMenuPrivate *in_RDI;
  QAction *action;
  QMenu *q;
  
  q_func(in_RDI);
  QObject::sender();
  _t1 = qobject_cast<QAction*>((QObject *)0x645b8e);
  if (_t1 != (QAction *)0x0) {
    QMenu::hovered((QMenu *)0x645ba7,_t1);
  }
  return;
}

Assistant:

void QMenuPrivate::_q_actionHovered()
{
    Q_Q(QMenu);
    if (QAction * action = qobject_cast<QAction *>(q->sender())) {
        emit q->hovered(action);
    }
}